

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# DescriptorPoolManager.cpp
# Opt level: O0

void __thiscall
Diligent::DescriptorSetAllocator::~DescriptorSetAllocator(DescriptorSetAllocator *this)

{
  __int_type_conflict _Var1;
  Char *Message;
  char (*in_RCX) [205];
  undefined1 local_30 [8];
  string msg;
  DescriptorSetAllocator *this_local;
  
  msg.field_2._8_8_ = this;
  _Var1 = std::__atomic_base::operator_cast_to_int
                    ((__atomic_base *)&(this->super_DescriptorPoolManager).field_0xc4);
  if (_Var1 != 0) {
    FormatString<std::atomic<int>,char[205]>
              ((string *)local_30,(Diligent *)&(this->super_DescriptorPoolManager).field_0xc4,
               (atomic<int> *)
               " descriptor set(s) have not been returned to the allocator. If there are outstanding references to the sets in release queues, the app will crash when DescriptorSetAllocator::FreeDescriptorSet() is called"
               ,in_RCX);
    Message = (Char *)std::__cxx11::string::c_str();
    DebugAssertionFailed
              (Message,"~DescriptorSetAllocator",
               "/workspace/llm4binary/github/license_c_cmakelists/DiligentGraphics[P]DiligentCore/Graphics/GraphicsEngineVulkan/src/DescriptorPoolManager.cpp"
               ,0xc3);
    std::__cxx11::string::~string((string *)local_30);
  }
  DescriptorPoolManager::~DescriptorPoolManager(&this->super_DescriptorPoolManager);
  return;
}

Assistant:

DescriptorSetAllocator::~DescriptorSetAllocator()
{
    DEV_CHECK_ERR(m_AllocatedSetCounter == 0, m_AllocatedSetCounter, " descriptor set(s) have not been returned to the allocator. If there are outstanding references to the sets in release queues, the app will crash when DescriptorSetAllocator::FreeDescriptorSet() is called");
}